

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webectl.cpp
# Opt level: O3

void send_to_pid(int pid,string *msg)

{
  int __fd;
  long *plVar1;
  ssize_t sVar2;
  undefined8 extraout_RAX;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  uint __val;
  int iVar6;
  long *plVar7;
  long *__src;
  string __str;
  sockaddr_un name;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  sockaddr local_9e [6];
  
  plVar7 = (long *)0x1;
  __fd = socket(1,2,0);
  if (__fd < 0) {
    send_to_pid();
  }
  else {
    local_9e[0].sa_family = 1;
    __val = -pid;
    if (0 < pid) {
      __val = pid;
    }
    if (9 < __val) {
      plVar7 = (long *)0x4;
      uVar5 = (ulong)__val;
      do {
        uVar3 = (uint)uVar5;
        iVar6 = (int)plVar7;
        if (uVar3 < 100) {
          plVar7 = (long *)(ulong)(iVar6 - 2);
          goto LAB_00102adf;
        }
        if (uVar3 < 1000) {
          plVar7 = (long *)(ulong)(iVar6 - 1);
          goto LAB_00102adf;
        }
        if (uVar3 < 10000) goto LAB_00102adf;
        uVar5 = uVar5 / 10000;
        plVar7 = (long *)(ulong)(iVar6 + 4);
      } while (99999 < uVar3);
      plVar7 = (long *)(ulong)(iVar6 + 1);
    }
LAB_00102adf:
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct((ulong)local_100,(char)plVar7 - (char)(pid >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_100[0] + ((uint)pid >> 0x1f),(uint)plVar7,__val);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x10408e);
    plVar7 = &local_d0;
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_d0 = *plVar4;
      lStack_c8 = plVar1[3];
      local_e0 = plVar7;
    }
    else {
      local_d0 = *plVar4;
      local_e0 = (long *)*plVar1;
    }
    local_d8 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_e0);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_b0 = *plVar4;
      lStack_a8 = plVar1[3];
      __src = &local_b0;
    }
    else {
      local_b0 = *plVar4;
      __src = (long *)*plVar1;
    }
    local_b8 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    local_c0 = __src;
    strcpy(local_9e[0].sa_data,(char *)__src);
    if (__src != &local_b0) {
      operator_delete(__src);
    }
    if (local_e0 != plVar7) {
      operator_delete(local_e0);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0]);
    }
    sVar2 = sendto(__fd,(msg->_M_dataplus)._M_p,msg->_M_string_length,0,local_9e,0x6e);
    if (-1 < sVar2) {
      close(__fd);
      return;
    }
  }
  send_to_pid();
  if (local_e0 != plVar7) {
    operator_delete(local_e0);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void send_to_pid(int pid, std::string msg) {
    int sock;
    struct sockaddr_un name;
    sock = socket(AF_UNIX, SOCK_DGRAM, 0);
    IF_NEGATIVE_EXIT(sock);
    name.sun_family = AF_UNIX;
    strcpy(name.sun_path, ("/tmp/webed_" + std::to_string(pid) + ".sock").c_str());
    IF_NEGATIVE_EXIT(sendto(sock, msg.c_str(), msg.size(), 0, (struct sockaddr *)&name, sizeof(struct sockaddr_un)))
    close(sock);
}